

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

void __thiscall
r_comp::Preprocessor::instantiateClass
          (Preprocessor *this,Ptr *tpl_class,
          vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
          *tpl_args,string *instantiated_class_name)

{
  pointer psVar1;
  pointer pcVar2;
  Iteration IVar3;
  Preprocessor *pPVar4;
  _Node *p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  mapped_type *this_00;
  Class *this_01;
  pointer psVar7;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> members;
  list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  _tpl_args;
  string sset;
  Ptr replistruct;
  char buffer [255];
  Atom local_24c [4];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_248;
  Ptr local_230;
  Ptr *local_220;
  Preprocessor *local_218;
  _List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  local_210;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_1d8;
  undefined1 local_1c0 [8];
  _Alloc_hider local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_1a8;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_198;
  ReturnType local_180;
  Iteration IStack_17c;
  string local_178;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> local_158;
  undefined1 *local_138 [2];
  undefined1 local_128 [248];
  
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"[]","");
  std::__cxx11::string::_M_assign((string *)instantiated_class_name);
  std::__cxx11::string::substr((ulong)local_138,(ulong)instantiated_class_name);
  local_220 = tpl_class;
  std::__cxx11::string::operator=((string *)instantiated_class_name,(string *)local_138);
  if (local_138[0] != local_128) {
    operator_delete(local_138[0]);
  }
  instantiateClass::LastClassID = instantiateClass::LastClassID + 1;
  local_218 = this;
  sprintf((char *)local_138,"%lu");
  std::__cxx11::string::append((char *)instantiated_class_name);
  local_248.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_210._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_210;
  local_210._M_impl._M_node._M_size = 0;
  psVar7 = (tpl_args->
           super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (tpl_args->
           super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_210._M_impl._M_node.super__List_node_base._M_prev =
       local_210._M_impl._M_node.super__List_node_base._M_next;
  if (psVar7 != psVar1) {
    do {
      local_1c0 = (undefined1  [8])
                  (psVar7->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
      local_1b8._M_p =
           (pointer)(psVar7->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_p)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_p)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_p)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_p)->_M_use_count + 1;
        }
      }
      p_Var5 = std::__cxx11::
               list<std::shared_ptr<r_comp::RepliStruct>,std::allocator<std::shared_ptr<r_comp::RepliStruct>>>
               ::_M_create_node<std::shared_ptr<r_comp::RepliStruct>const&>
                         ((list<std::shared_ptr<r_comp::RepliStruct>,std::allocator<std::shared_ptr<r_comp::RepliStruct>>>
                           *)&local_210,(shared_ptr<r_comp::RepliStruct> *)local_1c0);
      std::__detail::_List_node_base::_M_hook(&p_Var5->super__List_node_base);
      local_210._M_impl._M_node._M_size = local_210._M_impl._M_node._M_size + 1;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_p !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_p);
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != psVar1);
  }
  pPVar4 = local_218;
  local_230.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (local_220->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_230.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (local_220->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_230.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_230.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_230.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_230.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_230.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  getMembers(local_218,&local_230,&local_248,
             (list<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
              *)&local_210,true);
  if (local_230.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_230.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pbVar6 = r_code::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](&pPVar4->m_metadata->class_names,(ulong)pPVar4->m_classOpcode);
  std::__cxx11::string::_M_assign((string *)pbVar6);
  r_code::Atom::SSet((ushort)local_24c,(uchar)pPVar4->m_classOpcode);
  pcVar2 = (instantiated_class_name->_M_dataplus)._M_p;
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,pcVar2,pcVar2 + instantiated_class_name->_M_string_length);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
            (&local_1d8,&local_248);
  Class::Class((Class *)local_1c0,local_24c,&local_178,&local_1d8,ANY);
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)pPVar4->m_metadata,instantiated_class_name);
  r_code::Atom::operator=(&this_00->atom,(Atom *)local_1c0);
  std::__cxx11::string::operator=((string *)&this_00->str_opcode,(string *)&local_1b8);
  local_158.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this_00->things_to_read).
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_158.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this_00->things_to_read).
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_start;
  local_158.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (this_00->things_to_read).
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (this_00->things_to_read).
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_198.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_start;
  (this_00->things_to_read).
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_198.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_finish;
  (this_00->things_to_read).
  super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_198.
       super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  local_198.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.super__Vector_base<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_158);
  this_00->type = local_180;
  this_00->use_as = IStack_17c;
  this_01 = r_code::vector<r_comp::Class>::operator[]
                      (&pPVar4->m_metadata->classes_by_opcodes,(ulong)pPVar4->m_classOpcode);
  r_code::Atom::operator=(&this_01->atom,&this_00->atom);
  std::__cxx11::string::_M_assign((string *)&this_01->str_opcode);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::operator=
            (&this_01->things_to_read,&this_00->things_to_read);
  IVar3 = this_00->use_as;
  this_01->type = this_00->type;
  this_01->use_as = IVar3;
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_198);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._M_p != &local_1a8) {
    operator_delete(local_1b8._M_p);
  }
  r_code::Atom::~Atom((Atom *)local_1c0);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  r_code::Atom::~Atom(local_24c);
  pPVar4->m_classOpcode = pPVar4->m_classOpcode + 1;
  std::__cxx11::
  _List_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  ::_M_clear(&local_210);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_248);
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0]);
  }
  return;
}

Assistant:

void Preprocessor::instantiateClass(RepliStruct::Ptr tpl_class, std::vector<RepliStruct::Ptr> &tpl_args, std::string &instantiated_class_name)
{
    static uint64_t LastClassID = 0;
    // remove the trailing [].
    std::string sset = "[]";
    instantiated_class_name = tpl_class->cmd;
    instantiated_class_name = instantiated_class_name.substr(0, instantiated_class_name.length() - sset.length());
    // append an ID to the tpl class name.
    char buffer[255];
    sprintf(buffer, "%lu", LastClassID++);
    instantiated_class_name += buffer;
    std::vector<StructureMember> members;
    std::list<RepliStruct::Ptr> _tpl_args;

    for (RepliStruct::Ptr replistruct : tpl_args) {
        _tpl_args.push_back(replistruct);
    }

    getMembers(tpl_class, members, _tpl_args, true);
    m_metadata->class_names[m_classOpcode] = instantiated_class_name;
    m_metadata->classes_by_opcodes[m_classOpcode] = m_metadata->classes[instantiated_class_name] = Class(Atom::SSet(m_classOpcode, members.size()), instantiated_class_name, members);
    ++m_classOpcode;
}